

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O2

void __thiscall jbcoin::STPathSet::STPathSet(STPathSet *this,SerialIter *sit,SField *name)

{
  byte bVar1;
  char cVar2;
  int hasCurrency;
  base_uint<160UL,_void> local_3dc;
  Currency currency;
  AccountID issuer;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> path;
  _Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> local_368;
  AccountID account;
  undefined4 uStack_334;
  ScopedStream local_1b8;
  
  (this->super_STBase).fName = name;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STPathSet_002f82c8;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value).super__Vector_base<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    while( true ) {
      bVar1 = SerialIter::get8(sit);
      if ((byte)(bVar1 + 1) < 2) break;
      if ((bVar1 & 0xce) != 0) {
        debugLog();
        cVar2 = (**(code **)(*(long *)account.pn._0_8_ + 0x10))(account.pn._0_8_,4);
        if (cVar2 != '\0') {
          debugLog();
          currency.pn[0] = issuer.pn[0];
          currency.pn[1] = issuer.pn[1];
          currency.pn[2] = 4;
          beast::Journal::ScopedStream::ScopedStream<char[18]>
                    ((ScopedStream *)&account,(Stream *)&currency,(char (*) [18])"Bad path element "
                    );
          std::ostream::operator<<(account.pn + 4,(uint)bVar1);
          std::operator<<((ostream *)(account.pn + 4)," in pathset");
          beast::Journal::ScopedStream::~ScopedStream((ScopedStream *)&account);
        }
        Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"bad path element");
      }
      hasCurrency = bVar1 & 0x10;
      account.pn[0] = 0;
      account.pn[1] = 0;
      account.pn[2] = 0;
      account.pn[3] = 0;
      stack0xfffffffffffffcc8 = (pointer)((ulong)stack0xfffffffffffffcc8 & 0xffffffff00000000);
      currency.pn[0] = 0;
      currency.pn[1] = 0;
      currency.pn[2] = 0;
      currency.pn[3] = 0;
      currency.pn[4] = 0;
      issuer.pn[0] = 0;
      issuer.pn[1] = 0;
      issuer.pn[2] = 0;
      issuer.pn[3] = 0;
      issuer.pn[4] = 0;
      if ((bVar1 & 1) != 0) {
        SerialIter::getBitString<160,void>(&local_3dc,sit);
        stack0xfffffffffffffcc8 = (pointer)CONCAT44(uStack_334,local_3dc.pn[4]);
        account.pn[0] = local_3dc.pn[0];
        account.pn[1] = local_3dc.pn[1];
        account.pn[2] = local_3dc.pn[2];
        account.pn[3] = local_3dc.pn[3];
      }
      if (hasCurrency != 0) {
        SerialIter::getBitString<160,void>(&local_3dc,sit);
        currency.pn[4] = local_3dc.pn[4];
        currency.pn[0] = local_3dc.pn[0];
        currency.pn[1] = local_3dc.pn[1];
        currency.pn[2] = local_3dc.pn[2];
        currency.pn[3] = local_3dc.pn[3];
      }
      if (0x1f < bVar1) {
        SerialIter::getBitString<160,void>(&local_3dc,sit);
        issuer.pn[4] = local_3dc.pn[4];
        issuer.pn[0] = local_3dc.pn[0];
        issuer.pn[1] = local_3dc.pn[1];
        issuer.pn[2] = local_3dc.pn[2];
        issuer.pn[3] = local_3dc.pn[3];
      }
      std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
      emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,int&>
                ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)&path,
                 (base_uint<160UL,_jbcoin::detail::AccountIDTag> *)&account,&currency,&issuer,
                 &hasCurrency);
    }
    if (path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
        _M_impl.super__Vector_impl_data._M_finish) break;
    std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::vector
              ((vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)&local_368,
               &path);
    account.pn._0_8_ = local_368._M_impl.super__Vector_impl_data._M_start;
    account.pn._8_8_ = local_368._M_impl.super__Vector_impl_data._M_finish;
    stack0xfffffffffffffcc8 = local_368._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_368._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back
              (&this->value,(value_type *)&account);
    std::_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::~_Vector_base
              ((_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *)
               &account);
    std::_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::~_Vector_base
              (&local_368);
    if (path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl
      .super__Vector_impl_data._M_finish =
           path.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (bVar1 == 0) {
      std::_Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::
      ~_Vector_base(&path.
                     super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                   );
      return;
    }
  }
  debugLog();
  cVar2 = (**(code **)(*(long *)account.pn._0_8_ + 0x10))(account.pn._0_8_,4);
  if (cVar2 != '\0') {
    debugLog();
    account.pn[0] = currency.pn[0];
    account.pn[1] = currency.pn[1];
    account.pn[2] = 4;
    beast::Journal::ScopedStream::ScopedStream<char[22]>
              (&local_1b8,(Stream *)&account,(char (*) [22])"Empty path in pathset");
    beast::Journal::ScopedStream::~ScopedStream(&local_1b8);
  }
  Throw<std::runtime_error,char_const(&)[11]>((char (*) [11])"empty path");
}

Assistant:

STPathSet::STPathSet (SerialIter& sit, SField const& name)
    : STBase(name)
{
    std::vector<STPathElement> path;
    for(;;)
    {
        int iType = sit.get8 ();

        if (iType == STPathElement::typeNone ||
            iType == STPathElement::typeBoundary)
        {
            if (path.empty ())
            {
                JLOG (debugLog().error())
                    << "Empty path in pathset";
                Throw<std::runtime_error> ("empty path");
            }

            push_back (path);
            path.clear ();

            if (iType == STPathElement::typeNone)
                return;
        }
        else if (iType & ~STPathElement::typeAll)
        {
            JLOG (debugLog().error())
                << "Bad path element " << iType << " in pathset";
            Throw<std::runtime_error> ("bad path element");
        }
        else
        {
            auto hasAccount = iType & STPathElement::typeAccount;
            auto hasCurrency = iType & STPathElement::typeCurrency;
            auto hasIssuer = iType & STPathElement::typeIssuer;

            AccountID account;
            Currency currency;
            AccountID issuer;

            if (hasAccount)
                account.copyFrom (sit.get160 ());

            if (hasCurrency)
                currency.copyFrom (sit.get160 ());

            if (hasIssuer)
                issuer.copyFrom (sit.get160 ());

            path.emplace_back (account, currency, issuer, hasCurrency);
        }
    }
}